

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

vector<OpTpl_*,_std::allocator<OpTpl_*>_> * __thiscall
PcodeCompile::newOutput
          (PcodeCompile *this,bool usesLocalKey,ExprTree *rhs,string *varname,uint4 size)

{
  VarnodeTpl *pVVar1;
  int iVar2;
  VarnodeTpl *newout;
  VarnodeSymbol *this_00;
  undefined4 extraout_var;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar3;
  undefined4 uVar4;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  newout = buildTemporary(this);
  if (size == 0) {
    pVVar1 = rhs->outvn;
    if (((pVVar1->size).type != real) || ((pVVar1->size).value_real == 0)) goto LAB_00352a6d;
    local_70._0_4_ = (pVVar1->size).type;
    local_70._4_4_ = *(undefined4 *)&(pVVar1->size).field_0x4;
    local_70._8_4_ = (pVVar1->size).value.handle_index;
    local_70._12_4_ = *(undefined4 *)((long)&(pVVar1->size).value + 4);
    uVar4 = *(undefined4 *)((long)&(pVVar1->size).value + 4);
    local_70._16_4_ = (undefined4)(pVVar1->size).value_real;
    local_70._20_4_ = *(undefined4 *)((long)&(pVVar1->size).value_real + 4);
    local_70._24_4_ = (pVVar1->size).select;
  }
  else {
    ConstTpl::ConstTpl((ConstTpl *)local_70,real,(ulong)size);
    uVar4 = local_70._12_4_;
  }
  *(undefined4 *)((long)&(newout->size).value + 4) = uVar4;
  *(undefined4 *)&(newout->size).value_real = local_70._16_4_;
  *(undefined4 *)((long)&(newout->size).value_real + 4) = local_70._20_4_;
  (newout->size).select = local_70._24_4_;
  (newout->size).type = local_70._0_4_;
  *(undefined4 *)&(newout->size).field_0x4 = local_70._4_4_;
  (newout->size).value.handle_index = local_70._8_4_;
  *(undefined4 *)((long)&(newout->size).value + 4) = local_70._12_4_;
LAB_00352a6d:
  ExprTree::setOutput(rhs,newout);
  this_00 = (VarnodeSymbol *)operator_new(0x58);
  VarnodeSymbol::VarnodeSymbol
            (this_00,varname,(newout->space).value.spaceid,(newout->offset).value_real,
             (int4)(newout->size).value_real);
  (*this->_vptr_PcodeCompile[1])(this,this_00);
  if ((!usesLocalKey) && (this->enforceLocalKey == true)) {
    iVar2 = (*this->_vptr_PcodeCompile[4])(this,this_00);
    std::operator+(&local_50,"Must use \'local\' keyword to define symbol \'",varname);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_50,"\'");
    (*this->_vptr_PcodeCompile[5])(this,CONCAT44(extraout_var,iVar2),local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)varname);
  operator_delete(varname);
  pvVar3 = ExprTree::toVector(rhs);
  return pvVar3;
}

Assistant:

vector<OpTpl *> *PcodeCompile::newOutput(bool usesLocalKey,ExprTree *rhs,string *varname,uint4 size)

{
  VarnodeSymbol *sym;
  VarnodeTpl *tmpvn = buildTemporary();
  if (size != 0)
    tmpvn->setSize(ConstTpl(ConstTpl::real,size)); // Size was explicitly specified
  else if ((rhs->getSize().getType()==ConstTpl::real)&&(rhs->getSize().getReal()!=0))
    tmpvn->setSize(rhs->getSize());	// Inherit size from unnamed expression result
				// Only inherit if the size is real, otherwise we
				// cannot build the VarnodeSymbol with a placeholder constant
  rhs->setOutput(tmpvn);
  sym = new VarnodeSymbol(*varname,tmpvn->getSpace().getSpace(),tmpvn->getOffset().getReal(),tmpvn->getSize().getReal()); // Create new symbol regardless
  addSymbol(sym);
  if ((!usesLocalKey) && enforceLocalKey)
    reportError(getLocation(sym), "Must use 'local' keyword to define symbol '"+*varname + "'");
  delete varname;
  return ExprTree::toVector(rhs);
}